

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O0

int deqp::gles31::Functional::anon_unknown_0::getLevelCount(ImageInfo *info)

{
  int iVar1;
  int iVar2;
  int y;
  IVec3 *v;
  int maxSize_1;
  int maxSize;
  IVec3 size;
  deUint32 target;
  ImageInfo *info_local;
  
  unique0x10000125 = info;
  size.m_data[1] = ImageInfo::getTarget(info);
  v = ImageInfo::getSize(stack0xffffffffffffffe8);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&maxSize_1,v);
  if (size.m_data[1] == 0x8d41) {
    info_local._4_4_ = 1;
  }
  else if (size.m_data[1] == 0x8c1a) {
    iVar1 = tcu::Vector<int,_3>::x((Vector<int,_3> *)&maxSize_1);
    iVar2 = tcu::Vector<int,_3>::y((Vector<int,_3> *)&maxSize_1);
    iVar1 = de::max<int>(iVar1,iVar2);
    info_local._4_4_ = deLog2Ceil32(iVar1);
  }
  else {
    iVar1 = tcu::Vector<int,_3>::x((Vector<int,_3> *)&maxSize_1);
    iVar2 = tcu::Vector<int,_3>::y((Vector<int,_3> *)&maxSize_1);
    y = tcu::Vector<int,_3>::z((Vector<int,_3> *)&maxSize_1);
    iVar2 = de::max<int>(iVar2,y);
    iVar1 = de::max<int>(iVar1,iVar2);
    info_local._4_4_ = deLog2Ceil32(iVar1);
  }
  return info_local._4_4_;
}

Assistant:

int getLevelCount (const ImageInfo& info)
{
	const deUint32	target	= info.getTarget();
	const IVec3		size	= info.getSize();

	if (target == GL_RENDERBUFFER)
		return 1;
	else if (target == GL_TEXTURE_2D_ARRAY)
	{
		const int maxSize = de::max(size.x(), size.y());

		return deLog2Ceil32(maxSize);
	}
	else
	{
		const int maxSize = de::max(size.x(), de::max(size.y(), size.z()));

		return deLog2Ceil32(maxSize);
	}
}